

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_sampler.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  pointer pbVar2;
  string *line;
  long lVar3;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_lines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  samples;
  ofstream ofs;
  allocator local_2e1;
  string local_2e0;
  char **local_2c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [32];
  _Base_ptr local_280;
  size_t local_278;
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  undefined1 local_238 [16];
  char local_228 [232];
  ios_base local_140 [272];
  
  if (2 < argc) {
    std::__cxx11::string::string((string *)&local_2e0,argv[1],(allocator *)local_270);
    local_2a0._8_8_ = 0;
    local_2a0._16_8_ = local_2a0._16_8_ & 0xffffffffffffff00;
    local_2a0._0_8_ = local_2a0 + 0x10;
    std::ifstream::ifstream(local_238,(string *)&local_2e0,_S_in);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)local_2a0,'\0');
    std::ifstream::~ifstream(local_238);
    line_break(&local_2b8,(string *)local_2a0);
    if ((undefined1 *)local_2a0._0_8_ != local_2a0 + 0x10) {
      operator_delete((void *)local_2a0._0_8_);
    }
    local_2c0 = argv;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    local_2a0._24_8_ = local_2a0 + 8;
    local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffff00000000;
    local_2a0._16_8_ = 0;
    local_278 = 0;
    local_280 = (_Base_ptr)local_2a0._24_8_;
    if (argc != 3) {
      lVar3 = 0x18;
      do {
        std::__cxx11::string::string
                  ((string *)local_270,*(char **)((long)local_2c0 + lVar3),&local_2e1);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        local_2e0._M_string_length = 0;
        local_2e0.field_2._M_local_buf[0] = '\0';
        std::ifstream::ifstream((istream *)local_238,(string *)local_270,_S_in);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_2e0,'\0');
        std::ifstream::~ifstream((istream *)local_238);
        line_break(&local_250,&local_2e0);
        find_samples(&local_250,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_2a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p);
        }
        if (local_270[0] != local_260) {
          operator_delete(local_270[0]);
        }
        lVar3 = lVar3 + 8;
      } while ((ulong)(uint)argc << 3 != lVar3);
    }
    pbVar4 = local_2b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_2b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar2 = local_2b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar3 = std::__cxx11::string::find((char *)pbVar2,0x1050b3,0);
        if (lVar3 != -1) {
          std::__cxx11::string::find((char *)pbVar2,0x1050b3,lVar3 + 2);
          std::__cxx11::string::substr((ulong)local_238,(ulong)pbVar2);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2a0,(key_type *)local_238);
          std::__cxx11::string::_M_assign((string *)pbVar2);
          if ((char *)local_238._0_8_ != local_228) {
            operator_delete((void *)local_238._0_8_);
          }
        }
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 != pbVar4);
    }
    std::ofstream::ofstream(local_238,local_2c0[2],_S_out);
    if (local_2b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = local_2b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != local_2b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_238._0_8_ = _VTT;
    *(undefined8 *)(local_238 + *(long *)(_VTT + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)(local_238 + 8));
    std::ios_base::~ios_base(local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
    return 0;
  }
  __assert_fail("3 <= argc",
                "/workspace/llm4binary/github/license_c_cmakelists/tzlaine[P]type_erasure/presentation/code_sampler/code_sampler.cpp"
                ,0x2e,"int main(int, char **)");
}

Assistant:

int main (int argc, char * argv[])
{
    assert(3 <= argc);

    const char * in_filename = argv[1];

    std::vector<std::string> file_lines = line_break(file_slurp(in_filename));

    std::map<std::string, std::string> samples;
    std::for_each(argv + 3, argv + argc,
                  [&](const char * filename) {
                      find_samples(line_break(file_slurp(filename)), samples);
                  });

    for (std::string & line : file_lines) {
        std::string::size_type sample_ref_pos = line.find("%%");
        if (sample_ref_pos != std::string::npos) {
            sample_ref_pos += 2;
            std::string::size_type sample_ref_end_pos =
                line.find("%%", sample_ref_pos);
            const std::string sample_name = line.substr(
                sample_ref_pos,
                sample_ref_end_pos - sample_ref_pos
            );
            line = samples[sample_name];
        }
    }

    const char * out_filename = argv[2];
    std::ofstream ofs(out_filename);
    for (const std::string & line : file_lines) {
        ofs << line << "\n";
    }

    return 0;
}